

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O1

bool flecs::_::pack_args_to_string<Position>(world_t *world,stringstream *str,bool is_each)

{
  char *__s;
  size_t sVar1;
  undefined7 in_register_00000011;
  ostream *poVar2;
  value_type id;
  
  __s = component_info<Position>::name(world);
  poVar2 = (ostream *)(str + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"",0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"",0);
  if ((int)CONCAT71(in_register_00000011,is_each) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ANY:",4);
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
  }
  return true;
}

Assistant:

bool pack_args_to_string(world_t *world, std::stringstream& str, bool is_each) {
    (void)world;

    std::array<const char*, sizeof...(Components)> ids = {
        (_::component_info<Components>::name(world))...
    };

    std::array<const char*, sizeof...(Components)> inout_modifiers = {
        (inout_modifier<Components>())...
    }; 

    std::array<const char*, sizeof...(Components)> optional_modifiers = {
        (optional_modifier<Components>())...
    };        

    size_t i = 0;
    for (auto id : ids) {
        if (i) {
            str << ",";
        }
        
        str << inout_modifiers[i];
        str << optional_modifiers[i];

        if (is_each) {
            str << "ANY:";
        }
        str << id;
        i ++;
    }  

    return i != 0;
}